

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_string.h
# Opt level: O2

void __thiscall
agge::annotated_string<char,_agge::style_modifier>::const_iterator::const_iterator
          (const_iterator *this,range *from,const_iterator next_annotation,
          const_iterator annotations_end)

{
  size_type sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  size_t sVar8;
  
  sVar7 = (from->
          super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).begin_index;
  uVar2 = *(undefined4 *)
           ((long)&(from->
                   super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).begin_index + 4);
  sVar8 = (from->
          super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).end_index;
  uVar3 = *(undefined4 *)
           ((long)&(from->
                   super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).end_index + 4);
  uVar4 = *(undefined4 *)
           ((long)&(from->
                   super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )._container + 4);
  uVar5 = *(undefined4 *)&from->_annotation;
  uVar6 = *(undefined4 *)((long)&from->_annotation + 4);
  *(undefined4 *)
   &(this->_current).
    super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._container =
       *(undefined4 *)
        &(from->
         super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         )._container;
  *(undefined4 *)
   ((long)&(this->_current).
           super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._container + 4) = uVar4;
  *(undefined4 *)&(this->_current)._annotation = uVar5;
  *(undefined4 *)((long)&(this->_current)._annotation + 4) = uVar6;
  *(int *)&(this->_current).
           super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .begin_index = (int)sVar7;
  *(undefined4 *)
   ((long)&(this->_current).
           super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .begin_index + 4) = uVar2;
  *(int *)&(this->_current).
           super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .end_index = (int)sVar8;
  *(undefined4 *)
   ((long)&(this->_current).
           super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .end_index + 4) = uVar3;
  (this->_next_annotation)._M_current = next_annotation._M_current;
  (this->_annotations_end)._M_current = annotations_end._M_current;
  if (annotations_end._M_current == next_annotation._M_current) {
    sVar1 = ((this->_current).
             super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._container)->_M_string_length;
    (this->_current).
    super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .end_index = sVar1;
    (this->_current).
    super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .begin_index = sVar1;
    return;
  }
  fetch_annotation(this);
  return;
}

Assistant:

inline annotated_string<CharT, AnnotationT>::const_iterator::const_iterator(const range &from,
			typename annotations_t::const_iterator next_annotation,
			typename annotations_t::const_iterator annotations_end)
		: _current(from), _next_annotation(next_annotation), _annotations_end(annotations_end)
	{
		if (_annotations_end != _next_annotation)
			fetch_annotation();
		else
			_current.set_end();
	}